

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void __thiscall
fmt::v9::detail::
iterator_buffer<std::back_insert_iterator<fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v9::detail::buffer_traits>
::grow(iterator_buffer<std::back_insert_iterator<fmt::v9::basic_memory_buffer<char,_250UL,_std::allocator<char>_>_>,_char,_fmt::v9::detail::buffer_traits>
       *this,size_t capacity)

{
  char *buf_data;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_RSI;
  buffer<char> *in_RDI;
  
  basic_memory_buffer<char,_250UL,_std::allocator<char>_>::resize(in_RSI,(size_t)in_RDI);
  buf_data = buffer<char>::operator[]<int>((buffer<char> *)in_RDI[1]._vptr_buffer,0);
  buffer<char>::set(in_RDI,buf_data,(size_t)in_RSI);
  return;
}

Assistant:

FMT_CONSTEXPR20 void grow(size_t capacity) override {
    container_.resize(capacity);
    this->set(&container_[0], capacity);
  }